

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O0

void __thiscall
GdlAttrValueSpec::FlattenPointSlotAttrs
          (GdlAttrValueSpec *this,GrcManager *pcman,
          vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *vpavsNew)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  Symbol pGVar4;
  GdlAttrValueSpec *pGVar5;
  undefined8 in_RSI;
  void *in_RDI;
  GdlAttrValueSpec *pavs;
  GdlLookupExpression *pexpLookup;
  bool fExpOkay;
  GdlExpression *pexpYoffset;
  GdlExpression *pexpXoffset;
  GdlExpression *pexpGpoint;
  GdlExpression *pexpY;
  GdlExpression *pexpX;
  Symbol psymYoffset;
  Symbol psymXoffset;
  Symbol psymGpoint;
  Symbol psymY;
  Symbol psymX;
  int nTmp;
  string *in_stack_fffffffffffffb68;
  GdlObject *gdl;
  undefined4 in_stack_fffffffffffffb70;
  SymbolType in_stack_fffffffffffffb74;
  GrcSymbolTableEntry *in_stack_fffffffffffffb78;
  vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *in_stack_fffffffffffffb80;
  GdlExpression *in_stack_fffffffffffffb88;
  Symbol in_stack_fffffffffffffb90;
  Symbol in_stack_fffffffffffffb98;
  GdlAttrValueSpec *in_stack_fffffffffffffba0;
  string *in_stack_fffffffffffffba8;
  GrcSymbolTableEntry *in_stack_fffffffffffffbb0;
  GrcSymbolTableEntry *in_stack_fffffffffffffbb8;
  GrcErrorList *in_stack_fffffffffffffbc0;
  undefined8 in_stack_fffffffffffffbc8;
  int nID;
  GrcErrorList *in_stack_fffffffffffffbd0;
  GdlLookupExpression *local_410;
  GrcSymbolTableEntry *in_stack_fffffffffffffc28;
  string local_318 [39];
  allocator local_2f1;
  string local_2f0 [32];
  string local_2d0 [39];
  allocator local_2a9;
  string local_2a8 [32];
  GdlLookupExpression *local_288;
  allocator local_279;
  string local_278 [39];
  byte local_251;
  long *local_250;
  long *local_248;
  GrcSymbolTableEntry *local_240;
  long local_238;
  long local_230;
  allocator local_221;
  string local_220 [32];
  Symbol local_200;
  allocator local_1f1;
  string local_1f0 [32];
  Symbol local_1d0;
  allocator local_1c1;
  string local_1c0 [32];
  Symbol local_1a0;
  allocator local_191;
  string local_190 [32];
  Symbol local_170;
  allocator local_161;
  string local_160 [32];
  Symbol local_140;
  string local_138 [39];
  allocator local_111;
  string local_110 [32];
  string local_f0 [40];
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [37];
  byte local_7b;
  byte local_7a;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [36];
  int local_1c [3];
  undefined8 local_10;
  
  nID = (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
  local_10 = in_RSI;
  bVar1 = GrcSymbolTableEntry::IsBogusSlotAttr(in_stack_fffffffffffffbb8);
  if (!bVar1) {
    bVar1 = GrcSymbolTableEntry::FitsSymbolType(in_stack_fffffffffffffb78,in_stack_fffffffffffffb74)
    ;
    if ((!bVar1) &&
       (bVar1 = GrcSymbolTableEntry::FitsSymbolType
                          (in_stack_fffffffffffffb78,in_stack_fffffffffffffb74), !bVar1)) {
      std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::push_back
                ((vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *)
                 CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                 (value_type *)in_stack_fffffffffffffb68);
      return;
    }
    bVar1 = GrcSymbolTableEntry::IsReadOnlySlotAttr(in_stack_fffffffffffffc28);
    if (bVar1) {
      std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::push_back
                ((vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *)
                 CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                 (value_type *)in_stack_fffffffffffffb68);
      return;
    }
    GrcSymbolTableEntry::FullName_abi_cxx11_(in_stack_fffffffffffffbb8);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                            (char *)in_stack_fffffffffffffb68);
    std::__cxx11::string::~string(local_f0);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_160,"x",&local_161);
      pGVar4 = GrcSymbolTableEntry::SubField(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      std::__cxx11::string::~string(local_160);
      std::allocator<char>::~allocator((allocator<char> *)&local_161);
      local_140 = pGVar4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_190,"y",&local_191);
      pGVar4 = GrcSymbolTableEntry::SubField(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      std::__cxx11::string::~string(local_190);
      std::allocator<char>::~allocator((allocator<char> *)&local_191);
      local_170 = pGVar4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1c0,"gpoint",&local_1c1);
      pGVar4 = GrcSymbolTableEntry::SubField(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      std::__cxx11::string::~string(local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
      local_1a0 = pGVar4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1f0,"xoffset",&local_1f1);
      pGVar4 = GrcSymbolTableEntry::SubField(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      std::__cxx11::string::~string(local_1f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
      local_1d0 = pGVar4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_220,"yoffset",&local_221);
      pGVar4 = GrcSymbolTableEntry::SubField(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      std::__cxx11::string::~string(local_220);
      std::allocator<char>::~allocator((allocator<char> *)&local_221);
      local_200 = pGVar4;
      GrcSymbolTableEntry::FitsSymbolType(in_stack_fffffffffffffb78,in_stack_fffffffffffffb74);
      local_230 = 0;
      local_238 = 0;
      local_240 = (GrcSymbolTableEntry *)0x0;
      local_248 = (long *)0x0;
      local_250 = (long *)0x0;
      gdl = (GdlObject *)&local_250;
      local_251 = (**(code **)(**(long **)((long)in_RDI + 0x38) + 0xa0))
                            (*(long **)((long)in_RDI + 0x38),local_10,&local_230,&local_238,
                             &local_240,&local_248);
      local_251 = local_251 & 1;
      if (local_251 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_278,"Invalid point arithmetic",&local_279);
        GrcErrorList::AddError
                  (in_stack_fffffffffffffbd0,nID,(GdlObject *)in_stack_fffffffffffffbc0,
                   &in_stack_fffffffffffffbb8->m_staFieldName);
        std::__cxx11::string::~string(local_278);
        std::allocator<char>::~allocator((allocator<char> *)&local_279);
        if (in_RDI == (void *)0x0) {
          return;
        }
        ~GdlAttrValueSpec((GdlAttrValueSpec *)
                          CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
        operator_delete(in_RDI,0x48);
        return;
      }
      if ((((local_230 == 0) && (local_238 == 0)) && (local_240 == (GrcSymbolTableEntry *)0x0)) &&
         (local_250 == (long *)0x0)) {
        if (*(long *)((long)in_RDI + 0x38) == 0) {
          local_410 = (GdlLookupExpression *)0x0;
        }
        else {
          local_410 = (GdlLookupExpression *)
                      __dynamic_cast(*(long *)((long)in_RDI + 0x38),&GdlExpression::typeinfo,
                                     &GdlLookupExpression::typeinfo,0);
        }
        local_288 = local_410;
        GdlLookupExpression::Name(local_410);
        bVar1 = GrcSymbolTableEntry::FitsSymbolType
                          (in_stack_fffffffffffffb78,in_stack_fffffffffffffb74);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2a8,"Glyph attribute is not a point: ",&local_2a9);
          GdlLookupExpression::Name(local_288);
          GrcSymbolTableEntry::FullName_abi_cxx11_(in_stack_fffffffffffffbb8);
          GrcErrorList::AddError
                    (in_stack_fffffffffffffbc0,(int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
                     (GdlObject *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                     (string *)in_stack_fffffffffffffba0);
          std::__cxx11::string::~string(local_2d0);
          std::__cxx11::string::~string(local_2a8);
          std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2f0,"Undefined glyph attribute: ",&local_2f1);
          GdlLookupExpression::Name(local_288);
          GrcSymbolTableEntry::FullName_abi_cxx11_(in_stack_fffffffffffffbb8);
          GrcErrorList::AddError
                    (in_stack_fffffffffffffbc0,(int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
                     (GdlObject *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                     (string *)in_stack_fffffffffffffba0);
          std::__cxx11::string::~string(local_318);
          std::__cxx11::string::~string(local_2f0);
          std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
        }
        if (in_RDI == (void *)0x0) {
          return;
        }
        ~GdlAttrValueSpec((GdlAttrValueSpec *)
                          CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
        operator_delete(in_RDI,0x48);
        return;
      }
      if (local_230 != 0) {
        pGVar5 = (GdlAttrValueSpec *)operator_new(0x48);
        GdlAttrValueSpec(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
                         in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
        GdlObject::CopyLineAndFile
                  ((GdlObject *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),gdl);
        SetFlattened(pGVar5,true);
        std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::push_back
                  (in_stack_fffffffffffffb80,(value_type *)in_stack_fffffffffffffb78);
      }
      if (local_238 != 0) {
        pGVar5 = (GdlAttrValueSpec *)operator_new(0x48);
        GdlAttrValueSpec(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
                         in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
        GdlObject::CopyLineAndFile
                  ((GdlObject *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),gdl);
        SetFlattened(pGVar5,true);
        std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::push_back
                  (in_stack_fffffffffffffb80,(value_type *)in_stack_fffffffffffffb78);
      }
      bVar1 = GrcManager::OffsetAttrs(&g_cman);
      if (bVar1) {
        if (local_240 != (GrcSymbolTableEntry *)0x0) {
          bVar1 = GrcSymbolTableEntry::IsBogusSlotAttr(in_stack_fffffffffffffbb8);
          if (bVar1) {
            in_stack_fffffffffffffbb8 = local_240;
            if (local_240 != (GrcSymbolTableEntry *)0x0) {
              (**(code **)(*(long *)local_240 + 0x10))();
            }
          }
          else {
            pGVar5 = (GdlAttrValueSpec *)operator_new(0x48);
            GdlAttrValueSpec(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
                             in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
            GdlObject::CopyLineAndFile
                      ((GdlObject *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                       gdl);
            SetFlattened(pGVar5,true);
            std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::push_back
                      (in_stack_fffffffffffffb80,(value_type *)in_stack_fffffffffffffb78);
          }
        }
        if (local_248 != (long *)0x0) {
          bVar1 = GrcSymbolTableEntry::IsBogusSlotAttr(in_stack_fffffffffffffbb8);
          if (bVar1) {
            if (local_248 != (long *)0x0) {
              (**(code **)(*local_248 + 0x10))();
            }
          }
          else {
            pGVar5 = (GdlAttrValueSpec *)operator_new(0x48);
            GdlAttrValueSpec(pGVar5,in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
                             in_stack_fffffffffffffb88);
            in_stack_fffffffffffffba0 = pGVar5;
            GdlObject::CopyLineAndFile
                      ((GdlObject *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                       gdl);
            SetFlattened(pGVar5,true);
            std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::push_back
                      (in_stack_fffffffffffffb80,(value_type *)in_stack_fffffffffffffb78);
          }
        }
        if (local_250 != (long *)0x0) {
          bVar1 = GrcSymbolTableEntry::IsBogusSlotAttr(in_stack_fffffffffffffbb8);
          if (bVar1) {
            if (local_250 != (long *)0x0) {
              (**(code **)(*local_250 + 0x10))();
            }
          }
          else {
            pGVar4 = (Symbol)operator_new(0x48);
            GdlAttrValueSpec(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,pGVar4,
                             in_stack_fffffffffffffb88);
            GdlObject::CopyLineAndFile
                      ((GdlObject *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                       gdl);
            SetFlattened((GdlAttrValueSpec *)pGVar4,true);
            std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::push_back
                      (in_stack_fffffffffffffb80,(value_type *)in_stack_fffffffffffffb78);
          }
        }
      }
      else {
        if ((local_240 != (GrcSymbolTableEntry *)0x0) && (local_240 != (GrcSymbolTableEntry *)0x0))
        {
          (**(code **)(*(long *)local_240 + 0x10))();
        }
        if ((local_248 != (long *)0x0) && (local_248 != (long *)0x0)) {
          (**(code **)(*local_248 + 0x10))();
        }
        if ((local_250 != (long *)0x0) && (local_250 != (long *)0x0)) {
          (**(code **)(*local_250 + 0x10))();
        }
      }
      if (in_RDI == (void *)0x0) {
        return;
      }
      ~GdlAttrValueSpec((GdlAttrValueSpec *)
                        CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      operator_delete(in_RDI,0x48);
      return;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_110,
               "Invalid point arithmetic; fields must be calculated independently in order to use ",
               &local_111);
    GrcSymbolTableEntry::FullName_abi_cxx11_(in_stack_fffffffffffffbb8);
    GrcErrorList::AddError
              (in_stack_fffffffffffffbc0,(int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
               (GdlObject *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
               (string *)in_stack_fffffffffffffba0);
    std::__cxx11::string::~string(local_138);
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    return;
  }
  std::allocator<char>::allocator();
  local_7a = 0;
  local_7b = 0;
  std::__cxx11::string::string(local_40,"xoffset",&local_41);
  bVar1 = GrcSymbolTableEntry::LastFieldIs
                    ((GrcSymbolTableEntry *)
                     CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                     in_stack_fffffffffffffb68);
  if (!bVar1) {
    std::allocator<char>::allocator();
    local_7a = 1;
    std::__cxx11::string::string(local_78,"yoffset",&local_79);
    local_7b = 1;
    bVar2 = GrcSymbolTableEntry::LastFieldIs
                      ((GrcSymbolTableEntry *)
                       CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                       in_stack_fffffffffffffb68);
    bVar1 = false;
    if (!bVar2) goto LAB_00148ed4;
  }
  bVar3 = (**(code **)(**(long **)((long)in_RDI + 0x38) + 0x38))
                    (*(long **)((long)in_RDI + 0x38),local_1c,0);
  bVar1 = false;
  if ((bVar3 & 1) != 0) {
    bVar1 = local_1c[0] == 0;
  }
LAB_00148ed4:
  if ((local_7b & 1) != 0) {
    std::__cxx11::string::~string(local_78);
  }
  if ((local_7a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"Invalid slot attribute: ",&local_a1);
    GrcSymbolTableEntry::FullName_abi_cxx11_(in_stack_fffffffffffffbb8);
    GrcErrorList::AddError
              (in_stack_fffffffffffffbc0,(int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
               (GdlObject *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
               (string *)in_stack_fffffffffffffba0);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  if (in_RDI != (void *)0x0) {
    ~GdlAttrValueSpec((GdlAttrValueSpec *)
                      CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
    operator_delete(in_RDI,0x48);
  }
  return;
}

Assistant:

void GdlAttrValueSpec::FlattenPointSlotAttrs(GrcManager * pcman,
	std::vector<GdlAttrValueSpec *> & vpavsNew)
{
	if (m_psymName->IsBogusSlotAttr())	// eg, shift.gpath
	{
		int nTmp;
		if ((m_psymName->LastFieldIs("xoffset") || m_psymName->LastFieldIs("yoffset")) &&
			m_pexpValue->ResolveToInteger(&nTmp, false) && nTmp == 0)
		{	// ignore
		}
		else
			g_errorList.AddError(4133, this,
				"Invalid slot attribute: ",
				m_psymName->FullName());
		delete this;
	}
	else if (m_psymName->FitsSymbolType(ksymtSlotAttrPtOff)		// attach.at, shift, etc.
		|| m_psymName->FitsSymbolType(ksymtSlotAttrPt))			// collision.min/max
	{
		if (m_psymName->IsReadOnlySlotAttr())
		{
			//	Eventually will produce an error--for now, just pass through as is.
			vpavsNew.push_back(this);
			return;
		}

		if (m_psymOperator->FullName() != "=")
		{
			//	Can't use +=, -= with entire points.
			g_errorList.AddError(4134, this,
				"Invalid point arithmetic; fields must be calculated independently in order to use ",
				m_psymOperator->FullName());
			return;
		}

		Symbol psymX = m_psymName->SubField("x");
		Symbol psymY = m_psymName->SubField("y");
		Symbol psymGpoint = m_psymName->SubField("gpoint");
		Symbol psymXoffset = m_psymName->SubField("xoffset");
		Symbol psymYoffset = m_psymName->SubField("yoffset");
		Assert(psymX);
		Assert(psymY);
		if (m_psymName->FitsSymbolType(ksymtSlotAttrPtOff))
		{
			Assert(psymGpoint);
			Assert(psymXoffset);
			Assert(psymYoffset);
		}
		else
		{
			Assert(psymGpoint == NULL);
			Assert(psymXoffset == NULL);
			Assert(psymYoffset == NULL);
		}

		GdlExpression * pexpX = NULL;
		GdlExpression * pexpY = NULL;
		GdlExpression * pexpGpoint = NULL;
		GdlExpression * pexpXoffset = NULL;
		GdlExpression * pexpYoffset = NULL;

		bool fExpOkay = m_pexpValue->PointFieldEquivalents(pcman,
			&pexpX, &pexpY, &pexpGpoint, &pexpXoffset, &pexpYoffset);
		if (!fExpOkay)
		{
			g_errorList.AddError(4135, this,
				"Invalid point arithmetic");
			delete this;
			return;
		}
		else if (!pexpX && !pexpY && !pexpGpoint && !pexpYoffset && !pexpYoffset)
		{
			GdlLookupExpression * pexpLookup =
				dynamic_cast<GdlLookupExpression *>(m_pexpValue);
			Assert(pexpLookup);
			if (pexpLookup->Name()->FitsSymbolType(ksymtGlyphAttr))
				g_errorList.AddError(4136, this,
					"Glyph attribute is not a point: ",
					pexpLookup->Name()->FullName());
			else
				g_errorList.AddError(4137, this,
					"Undefined glyph attribute: ",
					pexpLookup->Name()->FullName());
			delete this;
			return;
		}
		
		GdlAttrValueSpec * pavs;
		if (pexpX)
		{
			pavs = new GdlAttrValueSpec(psymX, m_psymOperator, pexpX);
			pavs->CopyLineAndFile(*this);
			pavs->SetFlattened(true);
			vpavsNew.push_back(pavs);
		}
		if (pexpY)
		{
			pavs = new GdlAttrValueSpec(psymY, m_psymOperator, pexpY);
			pavs->CopyLineAndFile(*this);
			pavs->SetFlattened(true);
			vpavsNew.push_back(pavs);
		}
		if (g_cman.OffsetAttrs())
		{
			if (pexpGpoint)
			{
				if (psymGpoint->IsBogusSlotAttr())
					delete pexpGpoint;
				else
				{
					pavs = new GdlAttrValueSpec(psymGpoint, m_psymOperator, pexpGpoint);
					pavs->CopyLineAndFile(*this);
					pavs->SetFlattened(true);
					vpavsNew.push_back(pavs);
				}
			}
			if (pexpXoffset)
			{
				if (psymXoffset->IsBogusSlotAttr())
					delete pexpXoffset;
				else
				{
					pavs = new GdlAttrValueSpec(psymXoffset, m_psymOperator, pexpXoffset);
					pavs->CopyLineAndFile(*this);
					pavs->SetFlattened(true);
					vpavsNew.push_back(pavs);
				}
			}
			if (pexpYoffset)
			{
				if (psymYoffset->IsBogusSlotAttr())
					delete pexpYoffset;
				else
				{
					pavs = new GdlAttrValueSpec(psymYoffset, m_psymOperator, pexpYoffset);
					pavs->CopyLineAndFile(*this);
					pavs->SetFlattened(true);
					vpavsNew.push_back(pavs);
				}
			}
		} else {
			if (pexpGpoint)
				delete pexpGpoint;
			if (pexpXoffset)
				delete pexpXoffset;
			if (pexpYoffset)
				delete pexpYoffset;
		}

		delete this;	// replaced
	}
	else
		vpavsNew.push_back(this);
}